

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool is_test_only(uint32_t counter,uint32_t period,uint32_t after,bool holdout_off,
                 uint32_t target_modulus)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,holdout_off) != 0) {
    return false;
  }
  if (after != 0) {
    return after < counter;
  }
  return counter % period == target_modulus;
}

Assistant:

bool is_test_only(uint32_t counter, uint32_t period, uint32_t after, bool holdout_off,
    uint32_t target_modulus)  // target should be 0 in the normal case, or period-1 in the case that emptylines separate
                              // examples
{
  if (holdout_off)
    return false;
  if (after == 0)  // hold out by period
    return (counter % period == target_modulus);
  else  // hold out by position
    return (counter > after);
}